

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbopl.cpp
# Opt level: O3

Channel * __thiscall
OPL::DOSBox::DBOPL::Channel::BlockTemplate<(OPL::DOSBox::DBOPL::SynthMode)0>
          (Channel *this,Chip *chip,Bit32u samples,Bit32s *output)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  Bit32u BVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint uVar9;
  ulong uVar10;
  code *pcVar8;
  
  iVar3 = this->op[0].totalLevel;
  if ((((this->op[0].volume + iVar3 < 0x180) ||
       ((this->op[0].rateZero >> (this->op[0].state & 0x1f) & 1) == 0)) ||
      (this->op[1].volume + this->op[1].totalLevel < 0x180)) ||
     ((this->op[1].rateZero >> (this->op[1].state & 0x1f) & 1) == 0)) {
    bVar1 = chip->tremoloValue;
    this->op[0].currentLevel = iVar3 + (uint)(this->op[0].tremoloMask & bVar1);
    BVar4 = this->op[0].waveAdd;
    this->op[0].waveCurrent = BVar4;
    bVar2 = chip->vibratoShift;
    if (this->op[0].vibStrength >> (bVar2 & 0x1f) != 0) {
      this->op[0].waveCurrent =
           (BVar4 - (int)chip->vibratoSign) +
           (this->op[0].vibrato >> (bVar2 & 0x1f) ^ (int)chip->vibratoSign);
    }
    this->op[1].currentLevel = (uint)(this->op[1].tremoloMask & bVar1) + this->op[1].totalLevel;
    BVar4 = this->op[1].waveAdd;
    this->op[1].waveCurrent = BVar4;
    if (this->op[1].vibStrength >> (bVar2 & 0x1f) != 0) {
      this->op[1].waveCurrent =
           (BVar4 - (int)chip->vibratoSign) +
           (this->op[1].vibrato >> (bVar2 & 0x1f) ^ (int)chip->vibratoSign);
    }
    if (samples != 0) {
      uVar10 = 0;
      do {
        iVar3 = this->old[1];
        iVar7 = this->old[0];
        bVar1 = this->feedback;
        this->old[0] = iVar3;
        pcVar8 = (code *)this->op[0].volHandler;
        if (((ulong)pcVar8 & 1) != 0) {
          pcVar8 = *(code **)(pcVar8 + *(long *)((long)&this->op[0].volHandler +
                                                *(long *)&this->op[0].field_0x8) + -1);
        }
        BVar4 = this->op[0].currentLevel;
        iVar5 = (*pcVar8)();
        uVar9 = this->op[0].waveIndex + this->op[0].waveCurrent;
        uVar6 = iVar5 + BVar4;
        iVar5 = 0;
        this->op[0].waveIndex = uVar9;
        if (uVar6 < 0x180) {
          iVar5 = (int)((uint)(ushort)(&MulTable)[uVar6] *
                       (int)this->op[0].waveBase
                            [(uVar9 >> 0x16) + ((uint)(iVar7 + iVar3) >> (bVar1 & 0x1f)) &
                             this->op[0].waveMask]) >> 0x10;
        }
        this->old[1] = iVar5;
        iVar3 = this->old[0];
        BVar4 = this->op[1].currentLevel;
        pcVar8 = (code *)this->op[1].volHandler;
        if (((ulong)pcVar8 & 1) != 0) {
          pcVar8 = *(code **)(pcVar8 + *(long *)((long)&this->op[1].volHandler +
                                                *(long *)&this->op[1].field_0x8) + -1);
        }
        iVar7 = (*pcVar8)();
        uVar9 = this->op[1].waveIndex + this->op[1].waveCurrent;
        uVar6 = iVar7 + BVar4;
        iVar7 = 0;
        this->op[1].waveIndex = uVar9;
        if (uVar6 < 0x180) {
          iVar7 = (int)((uint)(ushort)(&MulTable)[uVar6] *
                       (int)this->op[1].waveBase[uVar9 >> 0x16 & this->op[1].waveMask]) >> 0x10;
        }
        output[uVar10] = output[uVar10] + iVar7 + iVar3;
        uVar10 = uVar10 + 1;
      } while (samples != uVar10);
    }
  }
  else {
    this->old[0] = 0;
    this->old[1] = 0;
  }
  return this + 1;
}

Assistant:

Channel* Channel::BlockTemplate( Chip* chip, Bit32u samples, Bit32s* output ) {
	switch( mode ) {
	case sm2AM:
	case sm3AM:
		if ( Op(0)->Silent() && Op(1)->Silent() ) {
			old[0] = old[1] = 0;
			return (this + 1);
		}
		break;
	case sm2FM:
	case sm3FM:
		if ( Op(1)->Silent() ) {
			old[0] = old[1] = 0;
			return (this + 1);
		}
		break;
	case sm3FMFM:
		if ( Op(3)->Silent() ) {
			old[0] = old[1] = 0;
			return (this + 2);
		}
		break;
	case sm3AMFM:
		if ( Op(0)->Silent() && Op(3)->Silent() ) {
			old[0] = old[1] = 0;
			return (this + 2);
		}
		break;
	case sm3FMAM:
		if ( Op(1)->Silent() && Op(3)->Silent() ) {
			old[0] = old[1] = 0;
			return (this + 2);
		}
		break;
	case sm3AMAM:
		if ( Op(0)->Silent() && Op(2)->Silent() && Op(3)->Silent() ) {
			old[0] = old[1] = 0;
			return (this + 2);
		}
		break;
	case sm2Percussion:
		// This case was not handled in the DOSBox code either
		// thus we leave this blank.
		// TODO: Consider checking this.
		break;
	case sm3Percussion:
		// This case was not handled in the DOSBox code either
		// thus we leave this blank.
		// TODO: Consider checking this.
		break;
	case sm4Start:
		// This case was not handled in the DOSBox code either
		// thus we leave this blank.
		// TODO: Consider checking this.
		break;
	case sm6Start:
		// This case was not handled in the DOSBox code either
		// thus we leave this blank.
		// TODO: Consider checking this.
		break;
	}
	//Init the operators with the the current vibrato and tremolo values
	Op( 0 )->Prepare( chip );
	Op( 1 )->Prepare( chip );
	if ( mode > sm4Start ) {
		Op( 2 )->Prepare( chip );
		Op( 3 )->Prepare( chip );
	}
	if ( mode > sm6Start ) {
		Op( 4 )->Prepare( chip );
		Op( 5 )->Prepare( chip );
	}
	for ( Bitu i = 0; i < samples; i++ ) {
		//Early out for percussion handlers
		if ( mode == sm2Percussion ) {
			GeneratePercussion<false>( chip, output + i );
			continue;	//Prevent some unitialized value bitching
		} else if ( mode == sm3Percussion ) {
			GeneratePercussion<true>( chip, output + i * 2 );
			continue;	//Prevent some unitialized value bitching
		}

		//Do unsigned shift so we can shift out all bits but still stay in 10 bit range otherwise
		Bit32s mod = (Bit32u)((old[0] + old[1])) >> feedback;
		old[0] = old[1];
		old[1] = Op(0)->GetSample( mod );
		Bit32s sample;
		Bit32s out0 = old[0];
		if ( mode == sm2AM || mode == sm3AM ) {
			sample = out0 + Op(1)->GetSample( 0 );
		} else if ( mode == sm2FM || mode == sm3FM ) {
			sample = Op(1)->GetSample( out0 );
		} else if ( mode == sm3FMFM ) {
			Bits next = Op(1)->GetSample( out0 );
			next = Op(2)->GetSample( next );
			sample = Op(3)->GetSample( next );
		} else if ( mode == sm3AMFM ) {
			sample = out0;
			Bits next = Op(1)->GetSample( 0 );
			next = Op(2)->GetSample( next );
			sample += Op(3)->GetSample( next );
		} else if ( mode == sm3FMAM ) {
			sample = Op(1)->GetSample( out0 );
			Bits next = Op(2)->GetSample( 0 );
			sample += Op(3)->GetSample( next );
		} else if ( mode == sm3AMAM ) {
			sample = out0;
			Bits next = Op(1)->GetSample( 0 );
			sample += Op(2)->GetSample( next );
			sample += Op(3)->GetSample( 0 );
		}
		switch( mode ) {
		case sm2AM:
		case sm2FM:
			output[ i ] += sample;
			break;
		case sm3AM:
		case sm3FM:
		case sm3FMFM:
		case sm3AMFM:
		case sm3FMAM:
		case sm3AMAM:
			output[ i * 2 + 0 ] += sample & maskLeft;
			output[ i * 2 + 1 ] += sample & maskRight;
			break;
		case sm2Percussion:
			// This case was not handled in the DOSBox code either
			// thus we leave this blank.
			// TODO: Consider checking this.
			break;
		case sm3Percussion:
			// This case was not handled in the DOSBox code either
			// thus we leave this blank.
			// TODO: Consider checking this.
			break;
		case sm4Start:
			// This case was not handled in the DOSBox code either
			// thus we leave this blank.
			// TODO: Consider checking this.
			break;
		case sm6Start:
			// This case was not handled in the DOSBox code either
			// thus we leave this blank.
			// TODO: Consider checking this.
			break;
		}
	}
	switch( mode ) {
	case sm2AM:
	case sm2FM:
	case sm3AM:
	case sm3FM:
		return ( this + 1 );
	case sm3FMFM:
	case sm3AMFM:
	case sm3FMAM:
	case sm3AMAM:
		return( this + 2 );
	case sm2Percussion:
	case sm3Percussion:
		return( this + 3 );
	case sm4Start:
		// This case was not handled in the DOSBox code either
		// thus we leave this blank.
		// TODO: Consider checking this.
		break;
	case sm6Start:
		// This case was not handled in the DOSBox code either
		// thus we leave this blank.
		// TODO: Consider checking this.
		break;
	}
	return 0;
}